

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

Instr * __thiscall FlowGraph::RemoveInstr(FlowGraph *this,Instr *instr,GlobOpt *globOpt)

{
  IRKind IVar1;
  OpCode OVar2;
  ByteCodeUsesInstr *pBVar3;
  Func *this_00;
  bool bVar4;
  BOOL BVar5;
  LabelInstr *pLVar6;
  GlobOptBlockData *this_01;
  StackSym *pSVar7;
  ByteCodeUsesInstr *pBVar8;
  
  pBVar3 = (ByteCodeUsesInstr *)instr->m_prev;
  if (globOpt == (GlobOpt *)0x0) {
    IR::Instr::Remove(instr);
    instr = (Instr *)pBVar3;
  }
  else {
    IVar1 = instr->m_kind;
    if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
      pLVar6 = IR::Instr::AsLabelInstr(instr);
      pLVar6->field_0x78 = pLVar6->field_0x78 & 0xfe;
    }
    else {
      OVar2 = instr->m_opcode;
      if (IVar1 != InstrKindByteCodeUses || OVar2 != ByteCodeUses) {
        if ((OVar2 == LdElemI_A) && (bVar4 = IR::Instr::DoStackArgsOpt(instr), bVar4)) {
          this_01 = GlobOpt::CurrentBlockData(globOpt);
          BVar5 = GlobOptBlockData::IsArgumentsOpnd(this_01,instr->m_src1);
          if ((BVar5 != 0) &&
             (pSVar7 = Func::GetScopeObjSym(instr->m_func), pSVar7 != (StackSym *)0x0)) {
            pBVar8 = IR::ByteCodeUsesInstr::New(instr);
            pSVar7 = Func::GetScopeObjSym(instr->m_func);
            IR::ByteCodeUsesInstr::SetNonOpndSymbol(pBVar8,(pSVar7->super_Sym).m_id);
            IR::Instr::InsertAfter(instr,&pBVar8->super_Instr);
          }
        }
        pBVar8 = GlobOpt::ConvertToByteCodeUses(globOpt,instr);
        instr = (Instr *)pBVar3;
        if ((pBVar8 != (ByteCodeUsesInstr *)0x0) &&
           (pBVar8->propertySymUse = (PropertySym *)0x0, instr = &pBVar8->super_Instr,
           OVar2 == Yield)) {
          do {
            pBVar8 = (ByteCodeUsesInstr *)(pBVar8->super_Instr).m_next;
          } while ((pBVar8->super_Instr).m_opcode != GeneratorBailInLabel);
          this_00 = this->func;
          pLVar6 = IR::Instr::AsLabelInstr((Instr *)pBVar8);
          Func::RemoveDeadYieldOffsetResumeLabel(this_00,pLVar6);
          pLVar6 = IR::Instr::AsLabelInstr((Instr *)pBVar8);
          pLVar6->field_0x78 = pLVar6->field_0x78 & 0xfb;
        }
      }
    }
  }
  return &((ByteCodeUsesInstr *)instr)->super_Instr;
}

Assistant:

IR::Instr *
FlowGraph::RemoveInstr(IR::Instr *instr, GlobOpt * globOpt)
{
    IR::Instr *instrPrev = instr->m_prev;
    if (globOpt)
    {
        // Removing block during glob opt.  Need to maintain the graph so that
        // bailout will record the byte code use in case the dead code is exposed
        // by dyno-pogo optimization (where bailout need the byte code uses from
        // the dead blocks where it may not be dead after bailing out)
        if (instr->IsLabelInstr())
        {
            instr->AsLabelInstr()->m_isLoopTop = false;
            return instr;
        }
        else if (instr->IsByteCodeUsesInstr())
        {
            return instr;
        }

        /*
        *   Scope object has to be implicitly live whenever Heap Arguments object is live.
        *       - When we restore HeapArguments object in the bail out path, it expects the scope object also to be restored - if one was created.
        */
        Js::OpCode opcode = instr->m_opcode;
        if (opcode == Js::OpCode::LdElemI_A && instr->DoStackArgsOpt() &&
            globOpt->CurrentBlockData()->IsArgumentsOpnd(instr->GetSrc1()) && instr->m_func->GetScopeObjSym())
        {
            IR::ByteCodeUsesInstr * byteCodeUsesInstr = IR::ByteCodeUsesInstr::New(instr);
            byteCodeUsesInstr->SetNonOpndSymbol(instr->m_func->GetScopeObjSym()->m_id);
            instr->InsertAfter(byteCodeUsesInstr);
        }

        IR::ByteCodeUsesInstr * newByteCodeUseInstr = globOpt->ConvertToByteCodeUses(instr);
        if (newByteCodeUseInstr != nullptr)
        {
            // We don't care about property used in these instruction
            // It is only necessary for field copy prop so that we will keep the implicit call
            // up to the copy prop location.
            newByteCodeUseInstr->propertySymUse = nullptr;

            if (opcode == Js::OpCode::Yield)
            {
                IR::Instr *instrLabel = newByteCodeUseInstr->m_next;
                while (instrLabel->m_opcode != Js::OpCode::GeneratorBailInLabel)
                {
                    instrLabel = instrLabel->m_next;
                }
                func->RemoveDeadYieldOffsetResumeLabel(instrLabel->AsLabelInstr());
                instrLabel->AsLabelInstr()->m_hasNonBranchRef = false;
            }

            // Save the last instruction to update the block with
            return newByteCodeUseInstr;
        }
        else
        {
            return instrPrev;
        }
    }
    else
    {
        instr->Remove();
        return instrPrev;
    }
}